

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBodyEasy.cpp
# Opt level: O3

void __thiscall
chrono::ChBodyEasyMesh::ChBodyEasyMesh
          (ChBodyEasyMesh *this,shared_ptr<chrono::geometry::ChTriangleMeshConnected> *mesh,
          double density,bool compute_mass,bool visualize,bool collide,
          shared_ptr<chrono::ChMaterialSurface> *material,double sphere_swept,
          shared_ptr<chrono::collision::ChCollisionModel> *collision_model)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  shared_ptr<chrono::ChMaterialSurface> local_98;
  shared_ptr<chrono::geometry::ChTriangleMeshConnected> local_88;
  shared_ptr<chrono::collision::ChCollisionModel> local_78;
  double local_60;
  double local_58;
  string local_50;
  
  (this->super_ChBodyAuxRef).super_ChBody.super_ChLoadableUVW =
       (ChLoadableUVW)&PTR__ChLoadable_00b04a88;
  local_78.super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (collision_model->
           super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  local_78.super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (collision_model->
       super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>).
       _M_refcount._M_pi;
  p_Var1 = (collision_model->
           super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  local_60 = density;
  local_58 = sphere_swept;
  ChBodyAuxRef::ChBodyAuxRef
            (&this->super_ChBodyAuxRef,&PTR_construction_vtable_24__00b087f8,&local_78);
  if (local_78.super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.
               super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  (this->super_ChBodyAuxRef).super_ChBody.super_ChPhysicsItem.super_ChObj._vptr_ChObj =
       (_func_int **)0xb08298;
  (this->super_ChBodyAuxRef).super_ChBody.super_ChBodyFrame.super_ChFrameMoving<double>.
  super_ChFrame<double>._vptr_ChFrame = (_func_int **)0xb08598;
  (this->super_ChBodyAuxRef).super_ChBody.super_ChContactable_1vars<6>.super_ChContactable.
  _vptr_ChContactable = (_func_int **)0xb08630;
  (this->super_ChBodyAuxRef).super_ChBody.super_ChContactable_1vars<6>.
  super_ChVariableTupleCarrier_1vars<6>._vptr_ChVariableTupleCarrier_1vars =
       (_func_int **)(vtable + 0x458);
  (this->super_ChBodyAuxRef).super_ChBody.super_ChLoadableUVW = (ChLoadableUVW)0xb08768;
  local_88.super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (mesh->
            super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
            )._M_ptr;
  local_88.super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi =
       (mesh->
       super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>).
       _M_refcount._M_pi;
  p_Var1 = (mesh->
           super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
           )._M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"EasyMesh","");
  local_98.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_98.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
          _M_refcount._M_pi;
  p_Var1 = (material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  SetupBody(this,&local_88,&local_50,local_60,compute_mass,visualize,collide,&local_98,local_58);
  if (local_98.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (local_88.
      super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_88.
               super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

ChBodyEasyMesh::ChBodyEasyMesh(std::shared_ptr<geometry::ChTriangleMeshConnected> mesh,
                               double density,
                               bool compute_mass,
                               bool visualize,
                               bool collide,
                               std::shared_ptr<ChMaterialSurface> material,
                               double sphere_swept,
                               std::shared_ptr<collision::ChCollisionModel> collision_model)
    : ChBodyAuxRef(collision_model) {
    SetupBody(mesh, "EasyMesh", density, compute_mass, visualize, collide, material, sphere_swept);
}